

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O0

Error * ot::commissioner::RestoreFilePath(Error *__return_storage_ptr__,string *aPath)

{
  ErrorCode EVar1;
  uint uVar2;
  bool bVar3;
  allocator local_1a1;
  string local_1a0;
  undefined4 local_17c;
  Error local_178;
  Error local_150;
  byte local_122;
  byte local_121;
  string local_120;
  Error local_100;
  undefined1 local_d8 [8];
  string baseName;
  string dirName;
  string local_88;
  Error local_68;
  undefined1 local_40 [8];
  Error error;
  string *aPath_local;
  
  error.mMessage.field_2._8_8_ = aPath;
  Error::Error((Error *)local_40);
  std::__cxx11::string::string((string *)&local_88,(string *)error.mMessage.field_2._8_8_);
  PathExists(&local_68,&local_88);
  EVar1 = Error::GetCode(&local_68);
  Error::~Error(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  if (EVar1 == kNone) {
    Error::Error(__return_storage_ptr__);
    local_17c = 1;
    goto LAB_001f1d57;
  }
  std::__cxx11::string::string((string *)(baseName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_d8);
  SplitPath((string *)error.mMessage.field_2._8_8_,(string *)(baseName.field_2._M_local_buf + 8),
            (string *)local_d8);
  uVar2 = std::__cxx11::string::empty();
  local_121 = 0;
  local_122 = 0;
  bVar3 = false;
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)&local_120,(string *)(baseName.field_2._M_local_buf + 8))
    ;
    local_121 = 1;
    PathExists(&local_100,&local_120);
    local_122 = 1;
    EVar1 = Error::GetCode(&local_100);
    bVar3 = EVar1 != kNone;
  }
  if ((local_122 & 1) != 0) {
    Error::~Error(&local_100);
  }
  if ((local_121 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_120);
  }
  if (bVar3) {
    RestoreDirPath(&local_150,(string *)((long)&baseName.field_2 + 8));
    Error::operator=((Error *)local_40,&local_150);
    Error::~Error(&local_150);
    Error::Error(&local_178);
    bVar3 = Error::operator!=((Error *)local_40,&local_178);
    Error::~Error(&local_178);
    if (!bVar3) goto LAB_001f1c5f;
    Error::Error(__return_storage_ptr__,(Error *)local_40);
  }
  else {
LAB_001f1c5f:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a0,anon_var_dwarf_3ea58f + 9,&local_1a1);
    WriteFile(__return_storage_ptr__,&local_1a0,(string *)error.mMessage.field_2._8_8_);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  }
  local_17c = 1;
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)(baseName.field_2._M_local_buf + 8));
LAB_001f1d57:
  Error::~Error((Error *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Error RestoreFilePath(const std::string &aPath)
{
    Error error;
    if (PathExists(aPath).GetCode() != ErrorCode::kNone)
    {
        std::string dirName, baseName;
        SplitPath(aPath, dirName, baseName);

        if (!dirName.empty() && (PathExists(dirName).GetCode() != ErrorCode::kNone))
        {
            error = RestoreDirPath(dirName);
            if (error != ERROR_NONE)
            {
                return error;
            }
        }

        // Attempt to create empty file
        return WriteFile("", aPath);
    }

    return ERROR_NONE;
}